

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhCursorDataLength(unqlite_kv_cursor *pCursor,unqlite_int64 *pLen)

{
  lhcell *pCell;
  lhash_kv_cursor *pCur;
  unqlite_int64 *pLen_local;
  unqlite_kv_cursor *pCursor_local;
  
  if ((*(int *)&pCursor[1].pStore == 2) && (pCursor[2].pStore != (unqlite_kv_engine *)0x0)) {
    *pLen = (unqlite_int64)pCursor[2].pStore[1].pIo;
    pCursor_local._4_4_ = 0;
  }
  else {
    pCursor_local._4_4_ = -9;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int lhCursorDataLength(unqlite_kv_cursor *pCursor,unqlite_int64 *pLen)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell */
	pCell = pCur->pCell;
	/* Return data length */
	*pLen = (unqlite_int64)pCell->nData;
	return UNQLITE_OK;
}